

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzbase.cpp
# Opt level: O3

void __thiscall lzham::CLZBase::init_slot_tabs(CLZBase *this)

{
  uint uVar1;
  sbyte sVar2;
  uint uVar3;
  uint8 *puVar4;
  ulong uVar5;
  
  if ((this->super_CLZDecompBase).m_num_lzx_slots != 0) {
    uVar5 = 0;
    do {
      uVar1 = (this->super_CLZDecompBase).m_lzx_position_base[uVar5];
      uVar3 = (this->super_CLZDecompBase).m_lzx_position_extra_mask[uVar5] + uVar1;
      sVar2 = 0;
      puVar4 = this->m_slot_tab0;
      if (((0xfff < uVar3) && (sVar2 = 0xb, puVar4 = this->m_slot_tab1, 0xfffff < uVar3)) &&
         (sVar2 = 0x10, puVar4 = this->m_slot_tab2, 0xffffff < uVar3)) {
        return;
      }
      uVar1 = uVar1 >> sVar2;
      memset(puVar4 + uVar1,(int)uVar5,(ulong)(((uVar3 >> sVar2) - uVar1) + 1));
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_CLZDecompBase).m_num_lzx_slots);
  }
  return;
}

Assistant:

void CLZBase::init_slot_tabs()
   {
      for (uint i = 0; i < m_num_lzx_slots; i++)
      {
         //printf("%u: 0x%08X - 0x%08X, %u\n", i, m_lzx_position_base[i], m_lzx_position_base[i] + (1 << m_lzx_position_extra_bits[i]) - 1, m_lzx_position_extra_bits[i]);

         uint lo = m_lzx_position_base[i];
         uint hi = lo + m_lzx_position_extra_mask[i];

         uint8* pTab;
         uint shift;
         uint n;

         if (hi < 0x1000)
         {
            pTab = m_slot_tab0;
            shift = 0;
            n = sizeof(m_slot_tab0);
         }
         else if (hi < 0x100000)
         {
            pTab = m_slot_tab1;
            shift = 11;
            n = sizeof(m_slot_tab1);
         }
         else if (hi < 0x1000000)
         {
            pTab = m_slot_tab2;
            shift = 16;
            n = sizeof(m_slot_tab2);
         }
         else
            break;

         lo >>= shift;
         hi >>= shift;

         LZHAM_ASSERT(hi < n);
         memset(pTab + lo, (uint8)i, hi - lo + 1);
      }

#ifdef LZHAM_BUILD_DEBUG      
      uint slot, ofs;
      for (uint i = 1; i < m_num_lzx_slots; i++) 
      {
         compute_lzx_position_slot(m_lzx_position_base[i], slot, ofs);
         LZHAM_ASSERT(slot == i);

         compute_lzx_position_slot(m_lzx_position_base[i] + m_lzx_position_extra_mask[i], slot, ofs);
         LZHAM_ASSERT(slot == i);
      }

      for (uint i = 1; i <= (m_dict_size-1); i += 512U*1024U)
      {
         compute_lzx_position_slot(i, slot, ofs);
         LZHAM_ASSERT(i == m_lzx_position_base[slot] + ofs);
      }

      compute_lzx_position_slot(m_dict_size - 1, slot, ofs);
      LZHAM_ASSERT((m_dict_size - 1) == m_lzx_position_base[slot] + ofs);
#endif      
   }